

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

void QuestUnserialize(string *serialized,Character *character)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  iterator iVar4;
  char cVar5;
  bool bVar6;
  pointer pbVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>,_bool> pVar8
  ;
  pair<std::_Rb_tree_iterator<Character_QuestState>,_bool> pVar9;
  Character *character_local;
  shared_ptr<Quest_Context> quest_context;
  Character_QuestState state;
  Quest *quest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> part;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  
  character_local = character;
  util::explode(&parts,';',serialized);
  bVar6 = false;
  pbVar7 = parts.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar7 == parts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&parts);
      return;
    }
    std::__cxx11::string::string((string *)&part,(string *)pbVar7);
    cVar5 = (char)&part;
    lVar3 = std::__cxx11::string::find(cVar5,0x2c);
    if (lVar3 != -1) {
      lVar3 = std::__cxx11::string::find(cVar5,0x2c);
      state.quest_state._M_dataplus._M_p = (pointer)&state.quest_state.field_2;
      state.quest_state._M_string_length = 0;
      state.quest_state.field_2._M_local_buf[0] = '\0';
      state.quest_progress._M_dataplus._M_p = (pointer)&state.quest_progress.field_2;
      state.quest_progress._M_string_length = 0;
      state.quest_progress.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::substr((ulong)&local_68,(ulong)&part);
      iVar2 = util::to_int(&local_68);
      state.quest_id = (short)iVar2;
      std::__cxx11::string::~string((string *)&local_68);
      if (lVar3 == -1) {
        std::__cxx11::string::find((char)&part,0x3b);
        std::__cxx11::string::substr((ulong)&local_68,(ulong)&part);
        std::__cxx11::string::operator=((string *)&state.quest_state,(string *)&local_68);
        std::__cxx11::string::~string((string *)&local_68);
LAB_0010dcda:
        std::__cxx11::string::assign((char *)&state.quest_progress);
LAB_0010dceb:
        bVar1 = !bVar6;
        bVar6 = true;
        if (bVar1) {
          Console::Wrn("Converting quests from old format...");
        }
      }
      else {
        std::__cxx11::string::substr((ulong)&local_68,(ulong)&part);
        std::__cxx11::string::operator=((string *)&state.quest_state,(string *)&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::substr((ulong)&local_68,(ulong)&part);
        std::__cxx11::string::operator=((string *)&state.quest_progress,(string *)&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        if (state.quest_progress._M_string_length == 0) goto LAB_0010dceb;
        if (*state.quest_progress._M_dataplus._M_p != '{') {
          Console::Wrn("State progress counter reset for quest: %i",(ulong)(uint)(int)state.quest_id
                      );
          goto LAB_0010dcda;
        }
      }
      iVar4 = std::
              _Rb_tree<short,_std::pair<const_short,_std::shared_ptr<Quest>_>,_std::_Select1st<std::pair<const_short,_std::shared_ptr<Quest>_>_>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest>_>_>_>
              ::find(&(character_local->world->quests)._M_t,&state.quest_id);
      if ((_Rb_tree_header *)iVar4._M_node ==
          &(character_local->world->quests)._M_t._M_impl.super__Rb_tree_header) {
        Console::Wrn("Quest not found: %i. Marking as inactive.",(ulong)(uint)(int)state.quest_id);
        pVar9 = std::
                _Rb_tree<Character_QuestState,_Character_QuestState,_std::_Identity<Character_QuestState>,_std::less<Character_QuestState>,_std::allocator<Character_QuestState>_>
                ::_M_insert_unique<Character_QuestState>
                          (&(character_local->quests_inactive)._M_t,&state);
        if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          Console::Wrn("Duplicate inactive quest record dropped for quest: %i",
                       (ulong)(uint)(int)state.quest_id);
        }
      }
      else {
        std::make_shared<Quest_Context,Character*&,Quest*&>
                  ((Character **)&quest_context,(Quest **)&character_local);
        EOPlus::Context::SetState
                  (&(quest_context.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->super_Context,&state.quest_state,false);
        Quest_Context::UnserializeProgress
                  (quest_context.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,(const_iterator)state.quest_progress._M_dataplus._M_p,
                   (const_iterator)
                   (state.quest_progress._M_dataplus._M_p + state.quest_progress._M_string_length));
        local_68._M_dataplus._M_p._0_2_ = state.quest_id;
        local_68._M_string_length =
             (size_type)
             quest_context.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_68.field_2._M_allocated_capacity =
             (size_type)
             quest_context.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
        quest_context.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        quest_context.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pVar8 = std::
                _Rb_tree<short,std::pair<short_const,std::shared_ptr<Quest_Context>>,std::_Select1st<std::pair<short_const,std::shared_ptr<Quest_Context>>>,std::less<short>,std::allocator<std::pair<short_const,std::shared_ptr<Quest_Context>>>>
                ::_M_emplace_unique<std::pair<short,std::shared_ptr<Quest_Context>>>
                          ((_Rb_tree<short,std::pair<short_const,std::shared_ptr<Quest_Context>>,std::_Select1st<std::pair<short_const,std::shared_ptr<Quest_Context>>>,std::less<short>,std::allocator<std::pair<short_const,std::shared_ptr<Quest_Context>>>>
                            *)&character_local->quests,
                           (pair<short,_std::shared_ptr<Quest_Context>_> *)&local_68);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_68.field_2._M_allocated_capacity);
        if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          Console::Wrn("Duplicate quest record dropped for quest: %i",
                       (ulong)(uint)(int)state.quest_id);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&quest_context.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      Character_QuestState::~Character_QuestState(&state);
    }
    std::__cxx11::string::~string((string *)&part);
    pbVar7 = pbVar7 + 1;
  } while( true );
}

Assistant:

void QuestUnserialize(std::string serialized, Character* character)
{
	bool conversion_warned = false;

	std::vector<std::string> parts = util::explode(';', serialized);

	UTIL_FOREACH(parts, part)
	{
		std::size_t pp1 = part.find_first_of(',');

		if (pp1 == std::string::npos)
			continue;

		std::size_t pp2 = part.find_first_of(',', pp1 + 1);

		Character_QuestState state;
		state.quest_id = util::to_int(part.substr(0, pp1));

		bool conversion_needed = false;

		if (pp2 != std::string::npos)
		{
			state.quest_state = part.substr(pp1 + 1, pp2 - pp1 - 1);
			state.quest_progress = part.substr(pp2 + 1);

			if (!state.quest_progress.empty() && state.quest_progress[0] != '{')
			{
				conversion_needed = true;

				// We could peek at the quest state for a possible matching rule here,
				// but it would greatly complicate the unserialization code.
				Console::Wrn("State progress counter reset for quest: %i", state.quest_id);
				state.quest_progress = "{}";
			}
			else if (state.quest_progress.empty())
			{
				conversion_needed = true;
			}
		}
		else
		{
			pp2 = part.find_first_of(';', pp1 + 1);

			if (pp2 == std::string::npos)
				pp2 = part.length() + 1;

			state.quest_state = part.substr(pp1 + 1, pp2 - pp1 - 1);
			state.quest_progress = "{}";

			conversion_needed = true;
		}

		if (conversion_needed)
		{
			if (!conversion_warned)
			{
				Console::Wrn("Converting quests from old format...");
				conversion_warned = true;
			}

			// Vodka leaves the quest state set to the end of the quest, which
			// means everyone will get stuck in an unfinished state
		}

		auto quest_it = character->world->quests.find(state.quest_id);

		if (quest_it == character->world->quests.end())
		{
			Console::Wrn("Quest not found: %i. Marking as inactive.", state.quest_id);

			// Store it in a non-activate state so we don't have to delete the data
			if (!character->quests_inactive.insert(std::move(state)).second)
				Console::Wrn("Duplicate inactive quest record dropped for quest: %i", state.quest_id);

			continue;
		}

		// WARNING: holds a non-tracked reference to shared_ptr
		Quest* quest = quest_it->second.get();
		auto quest_context(std::make_shared<Quest_Context>(character, quest));

		try
		{
			quest_context->SetState(state.quest_state, false);
			quest_context->UnserializeProgress(UTIL_CRANGE(state.quest_progress));
		}
		catch (EOPlus::Runtime_Error& ex)
		{
			Console::Wrn(ex.what());
			Console::Wrn("Could not resume quest: %i. Marking as inactive.", state.quest_id);

			if (!character->quests_inactive.insert(std::move(state)).second)
				Console::Wrn("Duplicate inactive quest record dropped for quest: %i", state.quest_id);

			continue;
		}

		auto result = character->quests.insert(std::make_pair(state.quest_id, std::move(quest_context)));

		if (!result.second)
		{
			Console::Wrn("Duplicate quest record dropped for quest: %i", state.quest_id);
			continue;
		}
	}
}